

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

int cpu_ldsw_data_ra_mipsel(CPUArchState_conflict8 *env,target_ulong_conflict ptr,uintptr_t retaddr)

{
  int iVar1;
  uintptr_t retaddr_local;
  target_ulong_conflict ptr_local;
  CPUArchState_conflict8 *env_local;
  
  iVar1 = cpu_mmu_index(env,false);
  iVar1 = cpu_ldsw_mmuidx_ra_mipsel(env,ptr,iVar1,retaddr);
  return iVar1;
}

Assistant:

int cpu_ldsw_data_ra(CPUArchState *env, target_ulong ptr, uintptr_t retaddr)
{
    return cpu_ldsw_mmuidx_ra(env, ptr, cpu_mmu_index(env, false), retaddr);
}